

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O2

ParseNodeBlock * __thiscall Parser::ParseBlock<true>(Parser *this,LabelId *pLabelId)

{
  BlockInfoStack *pBVar1;
  ParseNodeBlock *pPVar2;
  ParseNode *this_00;
  ParseNodeBlock *pnodeBlock;
  ParseNodePtr *ppPVar3;
  ParseNodeVar *pPVar4;
  PidRefStack *pPVar5;
  ParseNodePtr *local_38;
  ParseNodePtr *ppnodeScopeSave;
  ParseNodePtr *ppnodeExprScopeSave;
  
  local_38 = (ParseNodePtr *)0x0;
  ppnodeScopeSave = (ParseNodePtr *)0x0;
  pnodeBlock = StartParseBlockHelper<true>(this,Regular,(Scope *)0x0,pLabelId);
  pBVar1 = this->m_currentBlockInfo->pBlockInfoOuter;
  if ((((pBVar1 != (BlockInfoStack *)0x0) &&
       (pPVar2 = pBVar1->pnodeBlock, pPVar2 != (ParseNodeBlock *)0x0)) &&
      (pPVar2->scope != (Scope *)0x0)) && (pPVar2->scope->scopeType == ScopeType_CatchParamPattern))
  {
    ppPVar3 = &pPVar2->pnodeLexVars;
    while (this_00 = *ppPVar3, this_00 != (ParseNode *)0x0) {
      pPVar4 = ParseNode::AsParseNodeVar(this_00);
      pPVar5 = PushPidRef(this,pPVar4->sym->pid);
      pPVar4 = ParseNode::AsParseNodeVar(this_00);
      pPVar5->sym = pPVar4->sym;
      pPVar4 = ParseNode::AsParseNodeVar(this_00);
      ppPVar3 = &pPVar4->pnodeNext;
    }
  }
  ChkCurTok(this,0x52,-0x7ff5fc10);
  PushFuncBlockScope(this,pnodeBlock,&local_38,&ppnodeScopeSave);
  ParseStmtList<true>(this,&pnodeBlock->pnodeStmt,(ParseNodePtr **)0x0,SM_NotUsed,false,(bool *)0x0)
  ;
  PopFuncBlockScope(this,local_38,ppnodeScopeSave);
  FinishParseBlock(this,pnodeBlock,true);
  ChkCurTok(this,0x53,-0x7ff5fc0f);
  return pnodeBlock;
}

Assistant:

ParseNodeBlock * Parser::ParseBlock(LabelId* pLabelId)
{
    ParseNodeBlock * pnodeBlock = nullptr;
    ParseNodePtr *ppnodeScopeSave = nullptr;
    ParseNodePtr *ppnodeExprScopeSave = nullptr;

    pnodeBlock = StartParseBlock<buildAST>(PnodeBlockType::Regular, ScopeType_Block, pLabelId);

    BlockInfoStack* outerBlockInfo = m_currentBlockInfo->pBlockInfoOuter;
    if (outerBlockInfo != nullptr && outerBlockInfo->pnodeBlock != nullptr
        && outerBlockInfo->pnodeBlock->scope != nullptr
        && outerBlockInfo->pnodeBlock->scope->GetScopeType() == ScopeType_CatchParamPattern)
    {
        // If we are parsing the catch block then destructured params can have let declarations. Let's add them to the new block.
        for (ParseNodePtr pnode = m_currentBlockInfo->pBlockInfoOuter->pnodeBlock->pnodeLexVars; pnode; pnode = pnode->AsParseNodeVar()->pnodeNext)
        {
            PidRefStack* ref = PushPidRef(pnode->AsParseNodeVar()->sym->GetPid());
            ref->SetSym(pnode->AsParseNodeVar()->sym);
        }
    }

    ChkCurTok(tkLCurly, ERRnoLcurly);
    ParseNodePtr * ppnodeList = nullptr;
    if (buildAST)
    {
        PushFuncBlockScope(pnodeBlock, &ppnodeScopeSave, &ppnodeExprScopeSave);
        ppnodeList = &pnodeBlock->pnodeStmt;
    }

    ParseStmtList<buildAST>(ppnodeList);

    if (buildAST)
    {
        PopFuncBlockScope(ppnodeScopeSave, ppnodeExprScopeSave);
    }

    FinishParseBlock(pnodeBlock);

    ChkCurTok(tkRCurly, ERRnoRcurly);

    return pnodeBlock;
}